

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cc
# Opt level: O0

t_pvalue __thiscall
xemmai::t_type_of<xemmai::t_type_of<xemmai::t_object>_>::f_do_get
          (t_type_of<xemmai::t_type_of<xemmai::t_object>_> *this,t_object *a_this,t_object *a_key,
          size_t *a_index)

{
  t_type_of<xemmai::t_object> *this_00;
  pair<xemmai::t_slot,_xemmai::t_value<xemmai::t_slot>_> *ppVar1;
  t_object *ptVar2;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 extraout_RDX;
  ulong *in_R8;
  t_pvalue tVar3;
  ulong local_40;
  size_t i;
  t_type_of<xemmai::t_object> *type;
  size_t *a_index_local;
  t_object *a_key_local;
  t_object *a_this_local;
  t_type_of<xemmai::t_type_of<xemmai::t_object>_> *this_local;
  
  this_00 = t_object::f_as<xemmai::t_type_of<xemmai::t_object>>(a_key);
  local_40 = *in_R8;
  if ((this_00->v_instance_fields <= local_40) && (local_40 < this_00->v_fields)) {
    ppVar1 = t_type_of<xemmai::t_object>::f_fields(this_00);
    ptVar2 = t_slot::operator_cast_to_t_object_(&ppVar1[local_40].first);
    if (ptVar2 == (t_object *)a_index) goto LAB_0019723b;
  }
  local_40 = t_type_of<xemmai::t_object>::f_index(this_00,(t_object *)a_index);
  if ((local_40 < this_00->v_instance_fields) || (this_00->v_fields <= local_40)) {
    t_type_of<xemmai::t_object>::f_throw_undefined_field((t_object *)a_index);
  }
  *in_R8 = local_40;
LAB_0019723b:
  ppVar1 = t_type_of<xemmai::t_object>::f_fields(this_00);
  t_value<xemmai::t_pointer>::t_value<xemmai::t_slot>
            ((t_value<xemmai::t_pointer> *)this,&ppVar1[local_40].second);
  tVar3.field_0.v_integer = extraout_RDX.v_integer;
  tVar3.super_t_pointer.v_p = (t_object *)this;
  return tVar3;
}

Assistant:

t_pvalue t_class::f_do_get(t_object* a_this, t_object* a_key, size_t& a_index)
{
	auto& type = a_this->f_as<t_type>();
	auto i = a_index;
	if (i < type.v_instance_fields || i >= type.v_fields || type.f_fields()[i].first != a_key) {
		i = type.f_index(a_key);
		if (i < type.v_instance_fields || i >= type.v_fields) f_throw_undefined_field(a_key);
		a_index = i;
	}
	return type.f_fields()[i].second;
}